

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microsoft_pe.cpp
# Opt level: O1

ssize_t __thiscall
microsoft_pe_t::optional_header_data_dirs_t::_read
          (optional_header_data_dirs_t *this,int __fd,void *__buf,size_t __nbytes)

{
  kstream *pkVar1;
  microsoft_pe_t *pmVar2;
  uint32_t uVar3;
  data_dir_t *pdVar4;
  undefined4 extraout_var;
  
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_export_table = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_import_table = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_resource_table = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_exception_table = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_certificate_table = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_base_relocation_table = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_debug = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_architecture = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_global_ptr = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_tls_table = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_load_config_table = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_bound_import = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_iat = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_delay_import_descriptor = pdVar4;
  pdVar4 = (data_dir_t *)operator_new(0x20);
  pkVar1 = (this->super_kstruct).m__io;
  pmVar2 = this->m__root;
  (pdVar4->super_kstruct).m__io = pkVar1;
  pdVar4->m__parent = this;
  pdVar4->m__root = pmVar2;
  uVar3 = kaitai::kstream::read_u4le(pkVar1);
  pdVar4->m_virtual_address = uVar3;
  uVar3 = kaitai::kstream::read_u4le((pdVar4->super_kstruct).m__io);
  pdVar4->m_size = uVar3;
  this->m_clr_runtime_header = pdVar4;
  return CONCAT44(extraout_var,uVar3);
}

Assistant:

void microsoft_pe_t::optional_header_data_dirs_t::_read() {
    m_export_table = new data_dir_t(m__io, this, m__root);
    m_import_table = new data_dir_t(m__io, this, m__root);
    m_resource_table = new data_dir_t(m__io, this, m__root);
    m_exception_table = new data_dir_t(m__io, this, m__root);
    m_certificate_table = new data_dir_t(m__io, this, m__root);
    m_base_relocation_table = new data_dir_t(m__io, this, m__root);
    m_debug = new data_dir_t(m__io, this, m__root);
    m_architecture = new data_dir_t(m__io, this, m__root);
    m_global_ptr = new data_dir_t(m__io, this, m__root);
    m_tls_table = new data_dir_t(m__io, this, m__root);
    m_load_config_table = new data_dir_t(m__io, this, m__root);
    m_bound_import = new data_dir_t(m__io, this, m__root);
    m_iat = new data_dir_t(m__io, this, m__root);
    m_delay_import_descriptor = new data_dir_t(m__io, this, m__root);
    m_clr_runtime_header = new data_dir_t(m__io, this, m__root);
}